

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O0

bool SignSignature(SigningProvider *provider,CScript *fromPubKey,CMutableTransaction *txTo,uint nIn,
                  CAmount *amount,int nHashType,SignatureData *sig_data)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  uint in_ECX;
  CMutableTransaction *in_RDX;
  MutableTransactionSignatureCreator *in_RSI;
  CAmount *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  bool ret;
  MutableTransactionSignatureCreator creator;
  CTxIn *in_stack_ffffffffffffff58;
  undefined1 *__n;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (ulong)in_ECX;
  sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff58);
  if (sVar3 <= uVar2) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                  ,0x60,
                  "bool SignSignature(const SigningProvider &, const CScript &, CMutableTransaction &, unsigned int, const CAmount &, int, SignatureData &)"
                 );
  }
  __n = local_58;
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            (in_RSI,in_RDX,in_ECX,in_R8,in_R9D);
  bVar1 = ProduceSignature((SigningProvider *)creator.checker.amount,
                           (BaseSignatureCreator *)creator.checker._16_8_,
                           (CScript *)creator.checker.txTo,
                           (SignatureData *)
                           creator.checker.super_BaseSignatureChecker._vptr_BaseSignatureChecker);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::at
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),(size_type)__n);
  UpdateInput(in_stack_ffffffffffffff58,(SignatureData *)0xebf954);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool SignSignature(const SigningProvider &provider, const CScript& fromPubKey, CMutableTransaction& txTo, unsigned int nIn, const CAmount& amount, int nHashType, SignatureData& sig_data)
{
    assert(nIn < txTo.vin.size());

    MutableTransactionSignatureCreator creator(txTo, nIn, amount, nHashType);

    bool ret = ProduceSignature(provider, creator, fromPubKey, sig_data);
    UpdateInput(txTo.vin.at(nIn), sig_data);
    return ret;
}